

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O2

void UnitTest::unittest_assert(bool cond,char *code,char *file,int line)

{
  undefined7 in_register_00000039;
  _UnitTest_Compare local_30;
  
  if ((int)CONCAT71(in_register_00000039,cond) == 0) {
    if (DAT_00107160 == '\x01') {
      _DAT_0010715c = _DAT_0010715c + 1;
    }
    else {
      local_30.m_ip = 0x103754;
      local_30.m_failed = true;
      _UnitTest_Compare::printFirst();
      _UnitTest_Compare::printPosition(&local_30,file,line);
      if (local_30.m_failed == true) {
        _UnitTest_Compare::print("assert(");
      }
      if ((local_30.m_failed & 1U) != 0) {
        _UnitTest_Compare::print(code);
      }
      if ((local_30.m_failed & 1U) != 0) {
        _UnitTest_Compare::print(") failed.");
      }
      if ((local_30.m_failed & 1U) != 0) {
        _UnitTest_Compare::printLast();
      }
    }
  }
  return;
}

Assistant:

void unittest_assert(bool cond, const char *code, const char *file, int line) {
  if (!cond) {
    if (global_unit_test_object_.expect_assert_failure) {
      ++global_unit_test_object_.assert_failure;
    } else {
      _UnitTest_Compare(file, line) << "assert(" << code << ") failed.";
    }
  }
}